

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

_Bool malloc_init_hard(void)

{
  int8_t *piVar1;
  uint uVar2;
  malloc_init_t mVar3;
  pthread_t pVar4;
  _Bool _Var5;
  int iVar6;
  pthread_t pVar7;
  tsd_t *ptVar8;
  long lVar9;
  long lVar10;
  base_t *base;
  percpu_arena_mode_t pVar11;
  spin_t spinner;
  uint uVar12;
  ulong uVar13;
  
  iVar6 = pthread_mutex_trylock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
  if (iVar6 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&init_lock);
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  pVar4 = malloc_initializer;
  mVar3 = duckdb_je_malloc_init_state;
  init_lock.field_0.field_0.prof_data.n_lock_ops =
       init_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (init_lock.field_0.field_0.prof_data.prev_owner != (tsdn_t *)0x0) {
    init_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)0x0;
    init_lock.field_0.witness.link.qre_prev =
         (witness_t *)(init_lock.field_0.field_0.prof_data.n_owner_switches + 1);
  }
  if ((duckdb_je_malloc_init_state == malloc_init_initialized) ||
     (pVar7 = pthread_self(), mVar3 == malloc_init_recursible && pVar4 == pVar7)) {
LAB_01c67915:
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
    return false;
  }
  if (pVar4 != 0 && pVar4 != pVar7) {
    uVar12 = 0;
    do {
      init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
      if (uVar12 < 5) {
        for (uVar2 = 0; uVar2 >> ((byte)uVar12 & 0x1f) == 0; uVar2 = uVar2 + 1) {
        }
        uVar12 = uVar12 + 1;
      }
      else {
        sched_yield();
      }
      iVar6 = pthread_mutex_trylock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
      if (iVar6 != 0) {
        duckdb_je_malloc_mutex_lock_slow(&init_lock);
      }
      init_lock.field_0.field_0.prof_data.n_lock_ops =
           init_lock.field_0.field_0.prof_data.n_lock_ops + 1;
      if (init_lock.field_0.field_0.prof_data.prev_owner != (tsdn_t *)0x0) {
        init_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)0x0;
        init_lock.field_0.witness.link.qre_prev =
             (witness_t *)(init_lock.field_0.field_0.prof_data.n_owner_switches + 1);
      }
    } while (duckdb_je_malloc_init_state != malloc_init_initialized);
    goto LAB_01c67915;
  }
  if ((duckdb_je_malloc_init_state != malloc_init_a0_initialized) &&
     (_Var5 = malloc_init_hard_a0_locked(), _Var5)) {
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
    return true;
  }
  init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
  ptVar8 = duckdb_je_malloc_tsd_boot0();
  if (ptVar8 == (tsd_t *)0x0) {
    return true;
  }
  duckdb_je_malloc_init_state = malloc_init_recursible;
  lVar9 = sysconf(0x54);
  duckdb_je_ncpus = (uint)lVar9;
  if (lVar9 == -1) {
    duckdb_je_ncpus = 1;
  }
  if (duckdb_je_opt_percpu_arena != percpu_arena_disabled) {
    lVar9 = sysconf(0x54);
    lVar10 = sysconf(0x53);
    if ((lVar9 != lVar10) && (duckdb_je_opt_narenas == 0)) {
      duckdb_je_opt_percpu_arena = percpu_arena_disabled;
      duckdb_je_malloc_write
                (
                "<jemalloc>: Number of CPUs detected is not deterministic. Per-CPU arena disabled.\n"
                );
      if (duckdb_je_opt_abort_conf == true) {
        duckdb_je_malloc_printf
                  ("<jemalloc>: Abort (abort_conf:true) on invalid conf value (see above).\n");
        abort();
      }
      if (duckdb_je_opt_abort == true) goto LAB_01c67a21;
    }
  }
  iVar6 = pthread_atfork(duckdb_je_jemalloc_prefork,duckdb_je_jemalloc_postfork_parent,
                         duckdb_je_jemalloc_postfork_child);
  if (iVar6 == 0) {
    _Var5 = duckdb_je_background_thread_boot0();
    if (_Var5) {
      return true;
    }
    iVar6 = pthread_mutex_trylock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
    if (iVar6 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&init_lock);
      init_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
    }
    init_lock.field_0.field_0.prof_data.n_lock_ops =
         init_lock.field_0.field_0.prof_data.n_lock_ops + 1;
    if (&(init_lock.field_0.field_0.prof_data.prev_owner)->tsd != ptVar8) {
      init_lock.field_0.witness.link.qre_prev =
           (witness_t *)(init_lock.field_0.field_0.prof_data.n_owner_switches + 1);
      init_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)ptVar8;
    }
    ptVar8->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
         ptVar8->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
    if ((ptVar8->state).repr == '\0') {
      duckdb_je_tsd_slow_update(ptVar8);
    }
    if (duckdb_je_opt_percpu_arena != percpu_arena_disabled) {
      duckdb_je_opt_percpu_arena = percpu_arena_disabled;
      uVar13 = (ulong)duckdb_je_opt_narenas;
      if ((duckdb_je_opt_narenas == 0) && (uVar13 = 1, 1 < duckdb_je_ncpus)) {
        uVar12 = (uint)((ulong)(duckdb_je_ncpus << 0x10) * (ulong)duckdb_je_opt_narenas_ratio >>
                       0x10);
        iVar6 = (uVar12 >> 0x10) + (uint)((uVar12 >> 0xf & 1) != 0);
        uVar13 = (ulong)(iVar6 + (uint)(iVar6 == 0));
      }
      duckdb_je_malloc_printf
                ("<jemalloc>: perCPU arena getcpu() not available. Setting narenas to %u.\n",uVar13)
      ;
      if (duckdb_je_opt_abort == true) goto LAB_01c67a21;
    }
    if ((duckdb_je_opt_narenas == 0) && (duckdb_je_opt_narenas = 1, 1 < duckdb_je_ncpus)) {
      uVar12 = (uint)((ulong)(duckdb_je_ncpus << 0x10) * (ulong)duckdb_je_opt_narenas_ratio >> 0x10)
      ;
      iVar6 = (uVar12 >> 0x10) + (uint)((uVar12 >> 0xf & 1) != 0);
      duckdb_je_opt_narenas = iVar6 + (uint)(iVar6 == 0);
    }
    duckdb_je_narenas_auto = duckdb_je_opt_narenas;
    if (0xffe < duckdb_je_opt_narenas) {
      duckdb_je_narenas_auto = 0xffe;
      duckdb_je_malloc_printf("<jemalloc>: Reducing narenas to limit (%d)\n",0xffe);
    }
    narenas_total.repr = duckdb_je_narenas_auto;
    _Var5 = duckdb_je_arena_init_huge(a0);
    if (_Var5) {
      LOCK();
      narenas_total.repr = narenas_total.repr + 1;
      UNLOCK();
    }
    duckdb_je_manual_arena_base = narenas_total.repr;
    base = duckdb_je_b0get();
    _Var5 = duckdb_je_background_thread_boot1((tsdn_t *)ptVar8,base);
    if (!_Var5) {
      pVar11 = duckdb_je_opt_percpu_arena + percpu_arena;
      if (duckdb_je_opt_percpu_arena == percpu_arena_disabled) {
        pVar11 = duckdb_je_opt_percpu_arena;
      }
      duckdb_je_opt_percpu_arena = pVar11;
      _Var5 = duckdb_je_malloc_mutex_boot();
      if (!_Var5) {
        duckdb_je_malloc_init_state = malloc_init_initialized;
        malloc_slow_flags =
             duckdb_je_opt_utrace << 3 |
             duckdb_je_opt_zero << 2 | duckdb_je_opt_junk_free * '\x02' | duckdb_je_opt_junk_alloc |
             malloc_slow_flags | duckdb_je_opt_xmalloc << 4;
        duckdb_je_malloc_slow = malloc_slow_flags != 0;
        piVar1 = &ptVar8->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == '\0') {
          duckdb_je_tsd_slow_update(ptVar8);
        }
        init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
        pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
        duckdb_je_malloc_tsd_boot1();
        ptVar8 = (tsd_t *)__tls_get_addr(&PTR_024e0b60);
        if ((ptVar8->state).repr != '\0') {
          ptVar8 = duckdb_je_tsd_fetch_slow(ptVar8,false);
        }
        if (duckdb_je_opt_background_thread != true) {
          return false;
        }
        duckdb_je_background_thread_ctl_init((tsdn_t *)ptVar8);
        _Var5 = duckdb_je_background_thread_create(ptVar8,0);
        if (!_Var5) {
          return false;
        }
        return true;
      }
    }
    malloc_init_hard_cleanup((tsdn_t *)ptVar8,true);
    return true;
  }
  duckdb_je_malloc_write("<jemalloc>: Error in pthread_atfork()\n");
  if (duckdb_je_opt_abort != true) {
    return true;
  }
LAB_01c67a21:
  abort();
}

Assistant:

static bool
malloc_init_hard(void) {
	tsd_t *tsd;

#if defined(_WIN32) && _WIN32_WINNT < 0x0600
	_init_init_lock();
#endif
	malloc_mutex_lock(TSDN_NULL, &init_lock);

#define UNLOCK_RETURN(tsdn, ret, reentrancy)		\
	malloc_init_hard_cleanup(tsdn, reentrancy);	\
	return ret;

	if (!malloc_init_hard_needed()) {
		UNLOCK_RETURN(TSDN_NULL, false, false)
	}

	if (malloc_init_state != malloc_init_a0_initialized &&
	    malloc_init_hard_a0_locked()) {
		UNLOCK_RETURN(TSDN_NULL, true, false)
	}

	malloc_mutex_unlock(TSDN_NULL, &init_lock);
	/* Recursive allocation relies on functional tsd. */
	tsd = malloc_tsd_boot0();
	if (tsd == NULL) {
		return true;
	}
	if (malloc_init_hard_recursible()) {
		return true;
	}

	malloc_mutex_lock(tsd_tsdn(tsd), &init_lock);
	/* Set reentrancy level to 1 during init. */
	pre_reentrancy(tsd, NULL);
	/* Initialize narenas before prof_boot2 (for allocation). */
	if (malloc_init_narenas()
	    || background_thread_boot1(tsd_tsdn(tsd), b0get())) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}
	if (config_prof && prof_boot2(tsd, b0get())) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}

	malloc_init_percpu();

	if (malloc_init_hard_finish()) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}
	post_reentrancy(tsd);
	malloc_mutex_unlock(tsd_tsdn(tsd), &init_lock);

	witness_assert_lockless(witness_tsd_tsdn(
	    tsd_witness_tsdp_get_unsafe(tsd)));
	malloc_tsd_boot1();
	/* Update TSD after tsd_boot1. */
	tsd = tsd_fetch();
	if (opt_background_thread) {
		assert(have_background_thread);
		/*
		 * Need to finish init & unlock first before creating background
		 * threads (pthread_create depends on malloc).  ctl_init (which
		 * sets isthreaded) needs to be called without holding any lock.
		 */
		background_thread_ctl_init(tsd_tsdn(tsd));
		if (background_thread_create(tsd, 0)) {
			return true;
		}
	}
#undef UNLOCK_RETURN
	return false;
}